

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O1

void Io_ReadPlaMarkContained(word **pCs,int nCubes,int nWords,Vec_Bit_t *vMarks)

{
  ulong uVar1;
  int *piVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t __size;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong local_50;
  
  iVar11 = nCubes >> 5;
  if (vMarks->nCap < nCubes) {
    iVar12 = (iVar11 + 1) - (uint)((nCubes & 0x1fU) == 0);
    __size = (long)iVar12 << 2;
    if (vMarks->pArray == (int *)0x0) {
      piVar2 = (int *)malloc(__size);
    }
    else {
      piVar2 = (int *)realloc(vMarks->pArray,__size);
    }
    vMarks->pArray = piVar2;
    if (piVar2 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                    ,0x163,"void Vec_BitGrow(Vec_Bit_t *, int)");
    }
    vMarks->nCap = iVar12 * 0x20;
  }
  uVar3 = (uint)((nCubes & 0x1fU) != 0);
  iVar12 = uVar3 + iVar11;
  if (iVar12 != 0 && SCARRY4(uVar3,iVar11) == iVar12 < 0) {
    memset(vMarks->pArray,0,(ulong)(iVar12 - 1) * 4 + 4);
  }
  vMarks->nSize = iVar12 * 0x20;
  if (nCubes < 1) {
    return;
  }
  uVar5 = (ulong)(uint)nCubes;
  local_50 = 1;
  uVar9 = 0;
LAB_002d3b50:
  if ((long)vMarks->nSize <= (long)uVar9) {
LAB_002d3c5e:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                  ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
  }
  piVar2 = vMarks->pArray;
  uVar4 = uVar9 >> 5 & 0x7ffffff;
  uVar3 = (uint)uVar9 & 0x1f;
  uVar1 = uVar9 + 1;
  uVar10 = local_50;
  if (uVar1 < uVar5 && ((uint)piVar2[uVar4] >> uVar3 & 1) == 0) {
    do {
      if ((long)vMarks->nSize <= (long)uVar10) goto LAB_002d3c5e;
      uVar8 = uVar10 >> 5 & 0x7ffffff;
      uVar7 = (uint)uVar10 & 0x1f;
      if (((uint)piVar2[uVar8] >> uVar7 & 1) == 0) {
        if (0 < nWords) {
          uVar6 = 0;
          do {
            if ((pCs[uVar9][uVar6] & ~pCs[uVar10][uVar6]) != 0) {
              if (nWords < 1) goto LAB_002d3c27;
              uVar8 = 0;
              goto LAB_002d3c11;
            }
            uVar6 = uVar6 + 1;
          } while ((uint)nWords != uVar6);
        }
        piVar2[uVar8] = piVar2[uVar8] | 1 << uVar7;
      }
LAB_002d3bfb:
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar5);
  }
  goto LAB_002d3c3c;
LAB_002d3c11:
  if ((pCs[uVar10][uVar8] & ~pCs[uVar9][uVar8]) != 0) goto LAB_002d3bfb;
  uVar8 = uVar8 + 1;
  if ((uint)nWords == uVar8) goto LAB_002d3c27;
  goto LAB_002d3c11;
LAB_002d3c27:
  if ((long)vMarks->nSize <= (long)uVar9) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                  ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
  }
  piVar2[uVar4] = piVar2[uVar4] | 1 << (sbyte)uVar3;
LAB_002d3c3c:
  local_50 = local_50 + 1;
  uVar9 = uVar1;
  if (uVar1 == uVar5) {
    return;
  }
  goto LAB_002d3b50;
}

Assistant:

void Io_ReadPlaMarkContained( word ** pCs, int nCubes, int nWords, Vec_Bit_t * vMarks )
{
    int c1, c2;
    Vec_BitFill( vMarks, nCubes, 0 );
    for ( c1 = 0; c1 < nCubes; c1++ )
        if ( !Vec_BitEntry(vMarks, c1) )
            for ( c2 = c1 + 1; c2 < nCubes; c2++ )
                if ( !Vec_BitEntry(vMarks, c2) )
                {
                    if ( Abc_TtImply(pCs[c1], pCs[c2], nWords) )
                        Vec_BitWriteEntry( vMarks, c2, 1 );
                    else if ( Abc_TtImply(pCs[c2], pCs[c1], nWords) )
                    {
                        Vec_BitWriteEntry( vMarks, c1, 1 );
                        break;
                    }
                }
}